

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitRefNull(FunctionValidator *this,RefNull *curr)

{
  bool bVar1;
  Function *pFVar2;
  Module *pMVar3;
  ostream *poVar4;
  FeatureSet feats_00;
  bool local_55;
  string local_40;
  FeatureSet local_1c;
  RefNull *pRStack_18;
  FeatureSet feats;
  RefNull *curr_local;
  FunctionValidator *this_local;
  
  pRStack_18 = curr;
  local_1c = wasm::Type::getFeatures
                       (&(curr->super_SpecificExpression<(wasm::Expression::Id)41>).super_Expression
                         .type);
  pFVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
           getFunction(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      );
  local_55 = true;
  if (pFVar2 != (Function *)0x0) {
    pMVar3 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      );
    local_55 = FeatureSet::operator<=(&local_1c,&pMVar3->features);
  }
  feats_00.features = 0x29570ab;
  bVar1 = shouldBeTrue<wasm::RefNull*>
                    (this,local_55,pRStack_18,"ref.null requires additional features ");
  if (!bVar1) {
    poVar4 = getStream(this);
    pMVar3 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      );
    getMissingFeaturesList_abi_cxx11_
              (&local_40,(wasm *)pMVar3,(Module *)(ulong)local_1c.features,feats_00);
    poVar4 = std::operator<<(poVar4,(string *)&local_40);
    std::operator<<(poVar4,'\n');
    std::__cxx11::string::~string((string *)&local_40);
  }
  bVar1 = wasm::Type::isNullable
                    (&(pRStack_18->super_SpecificExpression<(wasm::Expression::Id)41>).
                      super_Expression.type);
  bVar1 = shouldBeTrue<wasm::RefNull*>(this,bVar1,pRStack_18,"ref.null types must be nullable");
  if (bVar1) {
    bVar1 = wasm::Type::isNull(&(pRStack_18->super_SpecificExpression<(wasm::Expression::Id)41>).
                                super_Expression.type);
    shouldBeTrue<wasm::RefNull*>(this,bVar1,pRStack_18,"ref.null must have a bottom heap type");
  }
  return;
}

Assistant:

void FunctionValidator::visitRefNull(RefNull* curr) {
  // If we are not in a function, this is a global location like a table. We
  // allow RefNull there as we represent tables that way regardless of what
  // features are enabled.
  auto feats = curr->type.getFeatures();
  if (!shouldBeTrue(!getFunction() || feats <= getModule()->features,
                    curr,
                    "ref.null requires additional features ")) {
    getStream() << getMissingFeaturesList(*getModule(), feats) << '\n';
  }
  if (!shouldBeTrue(
        curr->type.isNullable(), curr, "ref.null types must be nullable")) {
    return;
  }
  shouldBeTrue(
    curr->type.isNull(), curr, "ref.null must have a bottom heap type");
}